

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall
llvm::DWARFUnitVector::addUnitsImpl
          (DWARFUnitVector *this,DWARFContext *Context,DWARFObject *Obj,DWARFSection *Section,
          DWARFDebugAbbrev *DA,DWARFSection *RS,DWARFSection *LocSection,StringRef SS,
          DWARFSection *SOS,DWARFSection *AOS,DWARFSection *LS,bool LE,bool IsDWO,bool Lazy,
          DWARFSectionKind SectionKind)

{
  bool bVar1;
  iterator puVar2;
  pointer pDVar3;
  DWARFSection *pDVar4;
  __uniq_ptr_data<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>,_true,_true> _Var5;
  iterator __x;
  int local_f4;
  undefined1 local_f0 [8];
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> U;
  uint64_t Offset;
  iterator I;
  DWARFObject *local_d0;
  DWARFSection *local_c8;
  DWARFSection *local_c0;
  DWARFSection *local_b8;
  bool local_b0;
  bool local_af;
  DWARFDebugAbbrev *local_a8;
  DWARFSection *local_a0;
  DWARFSection *local_98;
  char *local_90;
  size_t local_88;
  DWARFSection *local_80;
  DWARFUnitVector *local_78;
  undefined1 local_70 [8];
  DWARFDataExtractor Data;
  bool Lazy_local;
  bool IsDWO_local;
  bool LE_local;
  DWARFSection *RS_local;
  DWARFDebugAbbrev *DA_local;
  DWARFSection *Section_local;
  DWARFObject *Obj_local;
  DWARFContext *Context_local;
  DWARFUnitVector *this_local;
  
  Data.Section._7_1_ = LE;
  Data.Section._6_1_ = IsDWO;
  Data.Section._5_1_ = Lazy;
  DWARFDataExtractor::DWARFDataExtractor((DWARFDataExtractor *)local_70,Obj,Section,LE,'\0');
  bVar1 = std::function::operator_cast_to_bool((function *)&this->Parser);
  if (!bVar1) {
    local_c0 = SOS;
    local_b8 = LS;
    local_b0 = (bool)(Data.Section._7_1_ & 1);
    local_af = (bool)(Data.Section._6_1_ & 1);
    local_98 = LocSection;
    local_90 = SS.Data;
    local_88 = SS.Length;
    local_80 = AOS;
    I = (iterator)Context;
    local_d0 = Obj;
    local_c8 = Section;
    local_a8 = DA;
    local_a0 = RS;
    local_78 = this;
    std::
    function<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>(unsigned_long,llvm::DWARFSectionKind,llvm::DWARFSection_const*,llvm::DWARFUnitIndex::Entry_const*)>
    ::operator=((function<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>(unsigned_long,llvm::DWARFSectionKind,llvm::DWARFSection_const*,llvm::DWARFUnitIndex::Entry_const*)>
                 *)&this->Parser,(anon_class_104_13_41d0730e *)&I);
  }
  if ((Data.Section._5_1_ & 1) == 0) {
    Offset = (uint64_t)
             SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ::begin((SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                      *)this);
    U._M_t.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
         (__uniq_ptr_data<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>,_true,_true>)
         (__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>)0x0;
    do {
      while( true ) {
        bVar1 = DataExtractor::isValidOffset
                          ((DataExtractor *)local_70,
                           (uint64_t)
                           U._M_t.
                           super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                           .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
        if (!bVar1) {
          return;
        }
        puVar2 = SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 ::end((SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                        *)this);
        if ((iterator)Offset == puVar2) break;
        pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                           ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            Offset);
        pDVar4 = DWARFUnit::getInfoSection(pDVar3);
        if (pDVar4 == Section) {
          pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::
                   operator->((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                              Offset);
          _Var5.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>)
               DWARFUnit::getOffset(pDVar3);
          if (_Var5.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
              _M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
              super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>)
              U._M_t.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
              _M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
              super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl) break;
        }
        Offset = Offset + 8;
      }
      std::
      function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
      ::operator()((function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
                    *)local_f0,(unsigned_long)&this->Parser,
                   (DWARFSectionKind)
                   U._M_t.
                   super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
                   super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,
                   (DWARFSection *)(ulong)SectionKind,(Entry *)Section);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_f0);
      if (bVar1) {
        pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                           ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            local_f0);
        U._M_t.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
        super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
        super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>,_true,_true>)
             DWARFUnit::getNextUnitOffset(pDVar3);
        __x = SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              ::insert((SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                        *)this,(iterator)Offset,
                       (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                       local_f0);
        Offset = (uint64_t)
                 std::next<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>
                           (__x,1);
        local_f4 = 0;
      }
      else {
        local_f4 = 3;
      }
      std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::~unique_ptr
                ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)local_f0);
    } while (local_f4 == 0);
  }
  return;
}

Assistant:

void DWARFUnitVector::addUnitsImpl(
    DWARFContext &Context, const DWARFObject &Obj, const DWARFSection &Section,
    const DWARFDebugAbbrev *DA, const DWARFSection *RS,
    const DWARFSection *LocSection, StringRef SS, const DWARFSection &SOS,
    const DWARFSection *AOS, const DWARFSection &LS, bool LE, bool IsDWO,
    bool Lazy, DWARFSectionKind SectionKind) {
  DWARFDataExtractor Data(Obj, Section, LE, 0);
  // Lazy initialization of Parser, now that we have all section info.
  if (!Parser) {
    Parser = [=, &Context, &Obj, &Section, &SOS,
              &LS](uint64_t Offset, DWARFSectionKind SectionKind,
                   const DWARFSection *CurSection,
                   const DWARFUnitIndex::Entry *IndexEntry)
        -> std::unique_ptr<DWARFUnit> {
      const DWARFSection &InfoSection = CurSection ? *CurSection : Section;
      DWARFDataExtractor Data(Obj, InfoSection, LE, 0);
      if (!Data.isValidOffset(Offset))
        return nullptr;
      const DWARFUnitIndex *Index = nullptr;
      if (IsDWO)
        Index = &getDWARFUnitIndex(Context, SectionKind);
      DWARFUnitHeader Header;
      if (!Header.extract(Context, Data, &Offset, SectionKind, Index,
                          IndexEntry))
        return nullptr;
      std::unique_ptr<DWARFUnit> U;
      if (Header.isTypeUnit())
        U = std::make_unique<DWARFTypeUnit>(Context, InfoSection, Header, DA,
                                             RS, LocSection, SS, SOS, AOS, LS,
                                             LE, IsDWO, *this);
      else
        U = std::make_unique<DWARFCompileUnit>(Context, InfoSection, Header,
                                                DA, RS, LocSection, SS, SOS,
                                                AOS, LS, LE, IsDWO, *this);
      return U;
    };
  }
  if (Lazy)
    return;
  // Find a reasonable insertion point within the vector.  We skip over
  // (a) units from a different section, (b) units from the same section
  // but with lower offset-within-section.  This keeps units in order
  // within a section, although not necessarily within the object file,
  // even if we do lazy parsing.
  auto I = this->begin();
  uint64_t Offset = 0;
  while (Data.isValidOffset(Offset)) {
    if (I != this->end() &&
        (&(*I)->getInfoSection() != &Section || (*I)->getOffset() == Offset)) {
      ++I;
      continue;
    }
    auto U = Parser(Offset, SectionKind, &Section, nullptr);
    // If parsing failed, we're done with this section.
    if (!U)
      break;
    Offset = U->getNextUnitOffset();
    I = std::next(this->insert(I, std::move(U)));
  }
}